

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteFieldEnumValueAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,bool builder)

{
  char *text;
  string local_90;
  string local_70;
  string local_50;
  
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  google::protobuf::FieldDescriptor::DebugString_abi_cxx11_();
  FirstLineOf(&local_50,&local_90);
  EscapeJavadoc(&local_70,&local_50);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * <code>$def$</code>\n",(char (*) [4])0x2c6936,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  switch(type) {
  case GETTER:
    text = " * @return The enum numeric value on the wire for $name$.\n";
    break;
  default:
    goto switchD_0022299d_caseD_3;
  case LIST_GETTER:
    text = " * @return A list containing the enum numeric values on the wire for $name$.\n";
    break;
  case LIST_INDEXED_GETTER:
    io::Printer::Print<>(printer," * @param index The index of the value to return.\n");
    text = " * @return The enum numeric value on the wire of $name$ at the given index.\n";
    break;
  case LIST_INDEXED_SETTER:
    io::Printer::Print<>(printer," * @param index The index to set the value at.\n");
  case SETTER:
    text = " * @param value The enum numeric value on the wire for $name$ to set.\n";
    break;
  case LIST_ADDER:
    text = " * @param value The enum numeric value on the wire for $name$ to add.\n";
    break;
  case LIST_MULTI_ADDER:
    text = " * @param values The enum numeric values on the wire for $name$ to add.\n";
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,text,(char (*) [5])0x2d29e2,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 0x18));
switchD_0022299d_caseD_3:
  if (builder) {
    io::Printer::Print<>(printer," * @return This builder for chaining.\n");
  }
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void WriteFieldEnumValueAccessorDocComment(io::Printer* printer,
                                           const FieldDescriptor* field,
                                           const FieldAccessorType type,
                                           const bool builder) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field);
  printer->Print(" * <code>$def$</code>\n", "def",
                 EscapeJavadoc(FirstLineOf(field->DebugString())));
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(
          " * @return The enum numeric value on the wire for $name$.\n", "name",
          field->camelcase_name());
      break;
    case SETTER:
      printer->Print(
          " * @param value The enum numeric value on the wire for $name$ to "
          "set.\n",
          "name", field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(
          " * @return A list containing the enum numeric values on the wire "
          "for $name$.\n",
          "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(
          " * @return The enum numeric value on the wire of $name$ at the "
          "given index.\n",
          "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(
          " * @param value The enum numeric value on the wire for $name$ to "
          "set.\n",
          "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(
          " * @param value The enum numeric value on the wire for $name$ to "
          "add.\n",
          "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(
          " * @param values The enum numeric values on the wire for $name$ to "
          "add.\n",
          "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}